

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread.c
# Opt level: O0

int debug_cond_wait(void *cond_,void *lock_,timeval *tv)

{
  int iVar1;
  debug_lock *lock;
  int r;
  timeval *tv_local;
  void *lock__local;
  void *cond__local;
  
  if (lock_ == (void *)0x0) {
    event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
               ,0x12d,"lock","debug_cond_wait");
  }
  if (*lock_ == -0x214f4ef4) {
    if (((lock_ != (void *)0x0) && (evthread_lock_debugging_enabled_ != 0)) &&
       (iVar1 = evthread_is_debug_lock_held_(lock_), iVar1 == 0)) {
      event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
                 ,0x12f,"evthread_is_debug_lock_held_(lock_)","debug_cond_wait");
    }
    evthread_debug_lock_mark_unlocked(0,(debug_lock *)lock_);
    iVar1 = (*original_cond_fns_.wait_condition)(cond_,*(void **)((long)lock_ + 0x18),tv);
    evthread_debug_lock_mark_locked(0,(debug_lock *)lock_);
    return iVar1;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evthread.c"
             ,0x12e,"DEBUG_LOCK_SIG == lock->signature","debug_cond_wait");
}

Assistant:

static int
debug_cond_wait(void *cond_, void *lock_, const struct timeval *tv)
{
	int r;
	struct debug_lock *lock = lock_;
	EVUTIL_ASSERT(lock);
	EVUTIL_ASSERT(DEBUG_LOCK_SIG == lock->signature);
	EVLOCK_ASSERT_LOCKED(lock_);
	evthread_debug_lock_mark_unlocked(0, lock);
	r = original_cond_fns_.wait_condition(cond_, lock->lock, tv);
	evthread_debug_lock_mark_locked(0, lock);
	return r;
}